

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::LayerNorm_x86_fma::forward_inplace(LayerNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [32];
  void *pvVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  bool bVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  ulong uVar30;
  int q;
  int iVar31;
  undefined1 (*pauVar32) [32];
  long lVar33;
  int iVar34;
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [32];
  undefined1 (*pauVar37) [32];
  int i;
  ulong uVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float _mean;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  float fVar45;
  float fVar66;
  __m128 _low;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar67;
  undefined1 auVar55 [32];
  float fVar68;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [64];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar104 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar105 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  __m128 _high;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [12];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar122 [12];
  undefined1 auVar132 [64];
  __m128 _a_128;
  undefined1 auVar134 [16];
  undefined1 auVar133 [16];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar135 [16];
  undefined1 auVar141 [64];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  
  iVar3 = bottom_top_blob->elempack;
  iVar31 = bottom_top_blob->dims;
  iVar34 = bottom_top_blob->w;
  pp_Var5 = this->_vptr_LayerNorm_x86_fma;
  p_Var6 = pp_Var5[-3];
  pauVar7 = *(undefined1 (**) [32])(&this->field_0xe0 + (long)p_Var6);
  pauVar8 = *(undefined1 (**) [32])(&this->field_0x128 + (long)p_Var6);
  if (iVar31 == 1) {
    iVar34 = iVar34 * iVar3;
    pvVar9 = bottom_top_blob->data;
    auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
    for (lVar23 = 0; (int)lVar23 + 8 <= iVar34; lVar23 = lVar23 + 8) {
      pfVar1 = (float *)((long)pvVar9 + lVar23 * 4);
      auVar65 = ZEXT3264(CONCAT428(auVar65._28_4_ + pfVar1[7],
                                   CONCAT424(auVar65._24_4_ + pfVar1[6],
                                             CONCAT420(auVar65._20_4_ + pfVar1[5],
                                                       CONCAT416(auVar65._16_4_ + pfVar1[4],
                                                                 CONCAT412(auVar65._12_4_ +
                                                                           pfVar1[3],
                                                                           CONCAT48(auVar65._8_4_ +
                                                                                    pfVar1[2],
                                                                                    CONCAT44(auVar65
                                                  ._4_4_ + pfVar1[1],auVar65._0_4_ + *pfVar1))))))))
      ;
    }
    auVar42 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar39 = auVar42._4_4_;
      fVar45 = auVar42._8_4_;
      auVar40._0_4_ = auVar42._12_4_;
      if (iVar34 < (int)lVar23 + 4) break;
      pfVar1 = (float *)((long)pvVar9 + lVar23 * 4);
      auVar42._0_4_ = auVar42._0_4_ + *pfVar1;
      auVar42._4_4_ = fVar39 + pfVar1[1];
      auVar42._8_4_ = fVar45 + pfVar1[2];
      auVar42._12_4_ = auVar40._0_4_ + pfVar1[3];
      lVar23 = lVar23 + 4;
    }
    fVar66 = 0.0;
    for (; (int)lVar23 < iVar34; lVar23 = lVar23 + 1) {
      fVar66 = fVar66 + *(float *)((long)pvVar9 + lVar23 * 4);
    }
    auVar41 = vhaddps_avx(auVar65._16_16_,auVar65._0_16_);
    auVar83 = vshufpd_avx(auVar42,auVar42,1);
    auVar41 = vhaddps_avx(auVar41,auVar41);
    auVar43._0_4_ = auVar83._0_4_ + auVar42._0_4_;
    auVar43._4_4_ = auVar83._4_4_ + fVar39;
    auVar43._8_4_ = auVar83._8_4_ + fVar45;
    auVar43._12_4_ = auVar83._12_4_ + auVar40._0_4_;
    auVar42 = vhaddps_avx(auVar41,auVar41);
    auVar40 = vmovshdup_avx(auVar43);
    auVar41._0_4_ = (auVar42._0_4_ + auVar40._0_4_ + auVar43._0_4_ + fVar66) / (float)iVar34;
    auVar41._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar42 = vshufps_avx(auVar41,auVar41,0);
    auVar97._16_16_ = auVar42;
    auVar97._0_16_ = auVar42;
    auVar42 = ZEXT816(0) << 0x20;
    for (lVar23 = 0; (int)lVar23 + 8 <= iVar34; lVar23 = lVar23 + 8) {
      auVar44 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar9 + lVar23 * 4),auVar97);
      auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar44,auVar44);
    }
    auVar40 = vshufps_avx(auVar41,auVar41,0);
    auVar83 = ZEXT816(0) << 0x20;
    for (; (int)lVar23 + 4 <= iVar34; lVar23 = lVar23 + 4) {
      auVar43 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar23 * 4),auVar40);
      auVar83 = vfmadd231ps_fma(auVar83,auVar43,auVar43);
    }
    auVar40 = ZEXT816(0) << 0x20;
    for (; (int)lVar23 < iVar34; lVar23 = lVar23 + 1) {
      auVar43 = ZEXT416((uint)(*(float *)((long)pvVar9 + lVar23 * 4) - auVar41._0_4_));
      auVar40 = vfmadd231ss_fma(auVar40,auVar43,auVar43);
    }
    auVar43 = vshufpd_avx(auVar83,auVar83,1);
    auVar84._0_4_ = auVar43._0_4_ + auVar83._0_4_;
    auVar84._4_4_ = auVar43._4_4_ + auVar83._4_4_;
    auVar84._8_4_ = auVar43._8_4_ + auVar83._8_4_;
    auVar84._12_4_ = auVar43._12_4_ + auVar83._12_4_;
    auVar42 = vhaddps_avx((undefined1  [16])0x0,auVar42);
    auVar83 = vmovshdup_avx(auVar84);
    auVar42 = vhaddps_avx(auVar42,auVar42);
    auVar42 = vhaddps_avx(auVar42,auVar42);
    fVar39 = (auVar42._0_4_ + auVar83._0_4_ + auVar84._0_4_ + auVar40._0_4_) / (float)iVar34 +
             *(float *)(&this->field_0xd4 + (long)p_Var6);
    auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
    auVar40 = vfmadd213ss_fma(ZEXT416((uint)(fVar39 * auVar42._0_4_)),auVar42,ZEXT416(0xc0400000));
    fVar39 = auVar42._0_4_ * -0.5 * auVar40._0_4_;
    fVar45 = fVar39 * -auVar41._0_4_;
    auVar40 = ZEXT416((uint)fVar39);
    auVar42 = vshufps_avx(auVar40,auVar40,0);
    auVar44._16_16_ = auVar42;
    auVar44._0_16_ = auVar42;
    auVar42 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
    auVar61._16_16_ = auVar42;
    auVar61._0_16_ = auVar42;
    auVar42 = ZEXT416((uint)fVar39);
    auVar41 = ZEXT416((uint)fVar45);
    if (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0) {
      for (lVar23 = 0; (int)lVar23 + 8 <= iVar34; lVar23 = lVar23 + 8) {
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar9 + lVar23 * 4),auVar61,auVar44)
        ;
        *(undefined1 (*) [32])((long)pvVar9 + lVar23 * 4) = ZEXT1632(auVar83);
      }
      auVar40 = vshufps_avx(auVar40,auVar40,0);
      auVar41 = vshufps_avx(auVar41,auVar41,0);
      for (; (int)lVar23 + 4 <= iVar34; lVar23 = lVar23 + 4) {
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar9 + lVar23 * 4),auVar41,auVar40)
        ;
        *(undefined1 (*) [16])((long)pvVar9 + lVar23 * 4) = auVar83;
      }
      for (; (int)lVar23 < iVar34; lVar23 = lVar23 + 1) {
        auVar40 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar9 + lVar23 * 4)),
                                  ZEXT416((uint)fVar45),auVar42);
        *(int *)((long)pvVar9 + lVar23 * 4) = auVar40._0_4_;
      }
    }
    else {
      for (lVar23 = 0; (int)lVar23 + 8 <= iVar34; lVar23 = lVar23 + 8) {
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar9 + lVar23 * 4),auVar61,auVar44)
        ;
        auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),*(undefined1 (*) [32])(*pauVar7 + lVar23 * 4),
                                  *(undefined1 (*) [32])(*pauVar8 + lVar23 * 4));
        *(undefined1 (*) [32])((long)pvVar9 + lVar23 * 4) = ZEXT1632(auVar40);
      }
      auVar40 = vshufps_avx(auVar42,auVar42,0);
      auVar83 = vshufps_avx(ZEXT416((uint)fVar45),auVar41,0);
      for (; (int)lVar23 + 4 <= iVar34; lVar23 = lVar23 + 4) {
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar9 + lVar23 * 4),auVar83,auVar40)
        ;
        auVar43 = vfmadd213ps_fma(auVar43,*(undefined1 (*) [16])(*pauVar7 + lVar23 * 4),
                                  *(undefined1 (*) [16])(*pauVar8 + lVar23 * 4));
        *(undefined1 (*) [16])((long)pvVar9 + lVar23 * 4) = auVar43;
      }
      for (; (int)lVar23 < iVar34; lVar23 = lVar23 + 1) {
        auVar40 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar9 + lVar23 * 4)),auVar41,auVar42);
        auVar40 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar7 + lVar23 * 4)),auVar40,
                                  ZEXT416(*(uint *)(*pauVar8 + lVar23 * 4)));
        *(int *)((long)pvVar9 + lVar23 * 4) = auVar40._0_4_;
      }
    }
  }
  else {
    uVar4 = bottom_top_blob->h;
    if (iVar31 == 3) {
      uVar26 = 0;
      uVar24 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar24 = uVar26;
      }
      if (*(int *)(&this->field_0xd0 + (long)p_Var6) == iVar34) {
        iVar31 = iVar34 * iVar3;
        fVar39 = 1.0 / (float)iVar34;
        auVar42 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
        uVar30 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar30 = uVar26;
        }
        for (; uVar26 != uVar24; uVar26 = uVar26 + 1) {
          pp_Var5 = this->_vptr_LayerNorm_x86_fma;
          for (uVar38 = 0; uVar38 != uVar30; uVar38 = uVar38 + 1) {
            pvVar9 = bottom_top_blob->data;
            sVar10 = bottom_top_blob->elemsize;
            lVar25 = bottom_top_blob->cstep * uVar26;
            lVar33 = (long)bottom_top_blob->w * uVar38;
            pauVar37 = (undefined1 (*) [32])((long)pvVar9 + lVar33 * sVar10 + lVar25 * sVar10);
            fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var5[-3]);
            lVar23 = 0;
            auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
            pauVar36 = pauVar37;
            iVar34 = 0;
            while( true ) {
              auVar40._0_4_ = auVar65._0_4_;
              fVar66 = auVar65._4_4_;
              fVar68 = auVar65._8_4_;
              fVar67 = auVar65._12_4_;
              fVar69 = auVar65._16_4_;
              fVar70 = auVar65._20_4_;
              fVar71 = auVar65._24_4_;
              if (iVar31 < iVar34 + 8) break;
              auVar65 = ZEXT3264(CONCAT428(auVar65._28_4_ + *(float *)(*pauVar36 + 0x1c),
                                           CONCAT424(fVar71 + *(float *)(*pauVar36 + 0x18),
                                                     CONCAT420(fVar70 + *(float *)(*pauVar36 + 0x14)
                                                               ,CONCAT416(fVar69 + *(float *)(*
                                                  pauVar36 + 0x10),
                                                  CONCAT412(fVar67 + *(float *)(*pauVar36 + 0xc),
                                                            CONCAT48(fVar68 + *(float *)(*pauVar36 +
                                                                                        8),
                                                                     CONCAT44(fVar66 + *(float *)(*
                                                  pauVar36 + 4),auVar40._0_4_ + *(float *)*pauVar36)
                                                  )))))));
              pauVar36 = pauVar36 + 1;
              lVar23 = lVar23 + 8;
              iVar34 = iVar34 + 8;
            }
            auVar78 = ZEXT816(0) << 0x40;
            while( true ) {
              iVar34 = iVar34 + 4;
              fVar72 = auVar78._0_4_;
              fVar11 = auVar78._4_4_;
              fVar12 = auVar78._8_4_;
              fVar13 = auVar78._12_4_;
              if (iVar31 < iVar34) break;
              auVar78._0_4_ = fVar72 + *(float *)*pauVar36;
              auVar78._4_4_ = fVar11 + *(float *)(*pauVar36 + 4);
              auVar78._8_4_ = fVar12 + *(float *)(*pauVar36 + 8);
              auVar78._12_4_ = fVar13 + *(float *)(*pauVar36 + 0xc);
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              lVar23 = lVar23 + 4;
            }
            lVar25 = sVar10 * (lVar25 + lVar33);
            fVar102 = 0.0;
            for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
              fVar102 = fVar102 + *(float *)((long)pvVar9 + lVar23 * 4 + lVar25);
            }
            fVar14 = auVar42._0_4_;
            fVar15 = auVar42._4_4_;
            fVar16 = auVar42._8_4_;
            fVar17 = auVar42._12_4_;
            if (iVar3 == 8) {
              auVar40._0_4_ = auVar40._0_4_ * fVar14;
              auVar40._4_4_ = fVar66 * fVar15;
              auVar40._8_4_ = fVar68 * fVar16;
              auVar40._12_4_ = fVar67 * fVar17;
              auVar130._16_4_ = fVar69 * fVar14;
              auVar130._0_16_ = auVar40;
              auVar130._20_4_ = fVar70 * fVar15;
              auVar130._28_36_ = in_ZMM12._28_36_;
              auVar130._24_4_ = fVar71 * fVar16;
              auVar93 = auVar130._0_32_;
              in_ZMM12 = ZEXT3264(auVar93);
              auVar134 = vshufps_avx(auVar40,auVar40,0);
              bVar21 = true;
              bVar27 = false;
              bVar22 = false;
            }
            else {
              if (iVar3 == 4) {
                auVar134._0_4_ = (fVar69 + auVar40._0_4_ + fVar72) * fVar14;
                auVar134._4_4_ = (fVar70 + fVar66 + fVar11) * fVar15;
                auVar134._8_4_ = (fVar71 + fVar68 + fVar12) * fVar16;
                auVar134._12_4_ = (auVar65._28_4_ + fVar67 + fVar13) * fVar17;
                bVar22 = true;
                bVar27 = false;
                auVar125 = auVar134;
                auVar40._0_4_ = auVar134._0_4_;
              }
              else {
                if (iVar3 != 1) {
                  auVar40._0_4_ = 0.0;
                  auVar125 = ZEXT816(0) << 0x40;
                  auVar134 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar41 = vshufpd_avx(auVar78,auVar78,1);
                  auVar40 = vhaddps_avx(auVar65._16_16_,auVar65._0_16_);
                  auVar79._0_4_ = auVar41._0_4_ + fVar72;
                  auVar79._4_4_ = auVar41._4_4_ + fVar11;
                  auVar79._8_4_ = auVar41._8_4_ + fVar12;
                  auVar79._12_4_ = auVar41._12_4_ + fVar13;
                  auVar40 = vhaddps_avx(auVar40,auVar40);
                  auVar41 = vmovshdup_avx(auVar79);
                  auVar40 = vhaddps_avx(auVar40,auVar40);
                  auVar40._0_4_ = (auVar40._0_4_ + auVar41._0_4_ + auVar79._0_4_ + fVar102) * fVar39
                  ;
                  auVar125._4_8_ = SUB128(ZEXT812(0),4);
                  auVar125._0_4_ = auVar40._0_4_;
                  auVar125._12_4_ = 0;
                  auVar134 = vshufps_avx(ZEXT416((uint)auVar40._0_4_),ZEXT416((uint)auVar40._0_4_),0
                                        );
                }
                bVar27 = iVar3 == 1;
                bVar22 = false;
              }
              in_ZMM12 = ZEXT1664(auVar125);
              auVar93._16_16_ = auVar134;
              auVar93._0_16_ = auVar134;
              bVar21 = false;
            }
            lVar23 = 0;
            auVar41 = ZEXT816(0) << 0x40;
            pauVar36 = pauVar37;
            iVar34 = 0;
            while (iVar34 + 8 <= iVar31) {
              auVar97 = vsubps_avx(*pauVar36,auVar93);
              auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar97,auVar97);
              pauVar36 = pauVar36 + 1;
              lVar23 = lVar23 + 8;
              iVar34 = iVar34 + 8;
            }
            auVar80 = ZEXT816(0) << 0x20;
            while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
              auVar83 = vsubps_avx(*(undefined1 (*) [16])*pauVar36,auVar134);
              auVar80 = vfmadd231ps_fma(auVar80,auVar83,auVar83);
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              lVar23 = lVar23 + 4;
            }
            auVar83 = ZEXT816(0) << 0x40;
            for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
              auVar43 = ZEXT416((uint)(*(float *)((long)pvVar9 + lVar23 * 4 + lVar25) -
                                      auVar40._0_4_));
              auVar83 = vfmadd231ss_fma(auVar83,auVar43,auVar43);
            }
            if (bVar21) {
              auVar65 = ZEXT2864(CONCAT424(fVar16 * 0.0,
                                           CONCAT420(fVar15 * 0.0,
                                                     CONCAT416(fVar14 * 0.0,
                                                               CONCAT412(auVar41._12_4_ * fVar17,
                                                                         CONCAT48(auVar41._8_4_ *
                                                                                  fVar16,CONCAT44(
                                                  auVar41._4_4_ * fVar15,auVar41._0_4_ * fVar14)))))
                                          ));
            }
            else {
              auVar65 = ZEXT1264(ZEXT812(0)) << 0x20;
            }
            if (bVar22) {
              fVar66 = auVar80._4_4_;
              fVar68 = auVar80._8_4_;
              fVar67 = auVar80._12_4_;
              auVar80._0_4_ = auVar41._0_4_ + auVar80._0_4_ + 0.0;
              auVar80._4_4_ = auVar41._4_4_ + fVar66 + 0.0;
              auVar80._8_4_ = auVar41._8_4_ + fVar68 + 0.0;
              auVar80._12_4_ = auVar41._12_4_ + fVar67 + 0.0;
              auVar97 = vblendps_avx(auVar65._0_32_,
                                     ZEXT1632(CONCAT412(auVar80._12_4_ * fVar17,
                                                        CONCAT48(auVar80._8_4_ * fVar16,
                                                                 CONCAT44(auVar80._4_4_ * fVar15,
                                                                          auVar80._0_4_ * fVar14))))
                                     ,0xf);
              auVar65 = ZEXT3264(auVar97);
            }
            if (bVar27) {
              auVar43 = vshufpd_avx(auVar80,auVar80,1);
              auVar81._0_4_ = auVar43._0_4_ + auVar80._0_4_;
              auVar81._4_4_ = auVar43._4_4_ + auVar80._4_4_;
              auVar81._8_4_ = auVar43._8_4_ + auVar80._8_4_;
              auVar81._12_4_ = auVar43._12_4_ + auVar80._12_4_;
              auVar41 = vhaddps_avx((undefined1  [16])0x0,auVar41);
              auVar43 = vmovshdup_avx(auVar81);
              auVar41 = vhaddps_avx(auVar41,auVar41);
              auVar41 = vhaddps_avx(auVar41,auVar41);
              auVar97 = vblendps_avx(auVar65._0_32_,
                                     ZEXT432((uint)((auVar41._0_4_ +
                                                    auVar83._0_4_ + auVar43._0_4_ + auVar81._0_4_) *
                                                   fVar39)),1);
              auVar65 = ZEXT3264(auVar97);
            }
            fVar66 = auVar65._0_4_;
            auVar137 = auVar65._0_32_;
            if (iVar3 == 1) {
              fVar66 = fVar66 + fVar45;
              auVar41 = vrsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 * auVar41._0_4_)),auVar41,
                                        ZEXT416(0xc0400000));
              fVar45 = auVar41._0_4_ * -0.5 * auVar83._0_4_;
              auVar137 = vblendps_avx(auVar137,ZEXT432((uint)fVar45),1);
              auVar97 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar45 * -auVar40._0_4_)),1);
              in_ZMM12 = ZEXT3264(auVar97);
            }
            else if (iVar3 == 4) {
              auVar40 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              auVar49._0_4_ = fVar66 + auVar40._0_4_;
              auVar49._4_4_ = auVar65._4_4_ + auVar40._4_4_;
              auVar49._8_4_ = auVar65._8_4_ + auVar40._8_4_;
              auVar49._12_4_ = auVar65._12_4_ + auVar40._12_4_;
              auVar41 = vrsqrtps_avx(auVar49);
              auVar50._0_4_ = auVar49._0_4_ * auVar41._0_4_;
              auVar50._4_4_ = auVar49._4_4_ * auVar41._4_4_;
              auVar50._8_4_ = auVar49._8_4_ * auVar41._8_4_;
              auVar50._12_4_ = auVar49._12_4_ * auVar41._12_4_;
              auVar104._8_4_ = 0xc0400000;
              auVar104._0_8_ = 0xc0400000c0400000;
              auVar104._12_4_ = 0xc0400000;
              auVar83 = vfmadd213ps_fma(auVar50,auVar41,auVar104);
              fVar45 = auVar41._0_4_ * -0.5 * auVar83._0_4_;
              auVar40._0_4_ = auVar41._4_4_ * -0.5 * auVar83._4_4_;
              fVar66 = auVar41._8_4_ * -0.5 * auVar83._8_4_;
              fVar68 = auVar41._12_4_ * -0.5 * auVar83._12_4_;
              auVar137 = vblendps_avx(auVar137,ZEXT1632(CONCAT412(fVar68,CONCAT48(fVar66,CONCAT44(
                                                  auVar40._0_4_,fVar45)))),0xf);
              auVar97 = vblendps_avx(in_ZMM12._0_32_,
                                     ZEXT1632(CONCAT412(fVar68 * -in_ZMM12._12_4_,
                                                        CONCAT48(fVar66 * -in_ZMM12._8_4_,
                                                                 CONCAT44(auVar40._0_4_ *
                                                                          -in_ZMM12._4_4_,
                                                                          fVar45 * -in_ZMM12._0_4_))
                                                       )),0xf);
              in_ZMM12 = ZEXT3264(auVar97);
            }
            else if (iVar3 == 8) {
              auVar40 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              auVar58._0_4_ = fVar66 + auVar40._0_4_;
              auVar58._4_4_ = auVar65._4_4_ + auVar40._4_4_;
              auVar58._8_4_ = auVar65._8_4_ + auVar40._8_4_;
              auVar58._12_4_ = auVar65._12_4_ + auVar40._12_4_;
              auVar58._16_4_ = auVar65._16_4_ + auVar40._0_4_;
              auVar58._20_4_ = auVar65._20_4_ + auVar40._4_4_;
              auVar58._24_4_ = auVar65._24_4_ + auVar40._8_4_;
              auVar58._28_4_ = auVar65._28_4_ + auVar40._12_4_;
              auVar97 = vrsqrtps_avx(auVar58);
              auVar19._4_4_ = auVar58._4_4_ * auVar97._4_4_;
              auVar19._0_4_ = auVar58._0_4_ * auVar97._0_4_;
              auVar19._8_4_ = auVar58._8_4_ * auVar97._8_4_;
              auVar19._12_4_ = auVar58._12_4_ * auVar97._12_4_;
              auVar19._16_4_ = auVar58._16_4_ * auVar97._16_4_;
              auVar19._20_4_ = auVar58._20_4_ * auVar97._20_4_;
              auVar19._24_4_ = auVar58._24_4_ * auVar97._24_4_;
              auVar19._28_4_ = auVar58._28_4_;
              auVar110._8_4_ = 0xc0400000;
              auVar110._0_8_ = 0xc0400000c0400000;
              auVar110._12_4_ = 0xc0400000;
              auVar110._16_4_ = 0xc0400000;
              auVar110._20_4_ = 0xc0400000;
              auVar110._24_4_ = 0xc0400000;
              auVar110._28_4_ = 0xc0400000;
              auVar40 = vfmadd213ps_fma(auVar19,auVar97,auVar110);
              auVar140._0_4_ = auVar97._0_4_ * -0.5 * auVar40._0_4_;
              auVar140._4_4_ = auVar97._4_4_ * -0.5 * auVar40._4_4_;
              auVar140._8_4_ = auVar97._8_4_ * -0.5 * auVar40._8_4_;
              auVar140._12_4_ = auVar97._12_4_ * -0.5 * auVar40._12_4_;
              auVar140._16_4_ = auVar97._16_4_ * -0.5 * 0.0;
              auVar140._20_4_ = auVar97._20_4_ * -0.5 * 0.0;
              auVar140._28_36_ = auVar65._28_36_;
              auVar140._24_4_ = auVar97._24_4_ * -0.5 * 0.0;
              auVar137 = auVar140._0_32_;
              auVar131._0_4_ = auVar140._0_4_ * -in_ZMM12._0_4_;
              auVar131._4_4_ = auVar140._4_4_ * -in_ZMM12._4_4_;
              auVar131._8_4_ = auVar140._8_4_ * -in_ZMM12._8_4_;
              auVar131._12_4_ = auVar140._12_4_ * -in_ZMM12._12_4_;
              auVar131._16_4_ = auVar140._16_4_ * -in_ZMM12._16_4_;
              auVar131._20_4_ = auVar140._20_4_ * -in_ZMM12._20_4_;
              auVar131._28_36_ = in_ZMM12._28_36_;
              auVar131._24_4_ = auVar140._24_4_ * -in_ZMM12._24_4_;
              in_ZMM12 = ZEXT3264(auVar131._0_32_);
            }
            auVar113 = in_ZMM12._0_32_;
            auVar41 = auVar137._0_16_;
            auVar40 = in_ZMM12._0_16_;
            if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
              auVar83 = auVar41;
              auVar43 = auVar40;
              if (!bVar22) {
                auVar83 = vshufps_avx(auVar41,auVar41,0);
                auVar43 = vshufps_avx(auVar40,auVar40,0);
              }
              if (!bVar21) {
                auVar137._16_16_ = auVar83;
                auVar137._0_16_ = auVar83;
                auVar113._16_16_ = auVar43;
                auVar113._0_16_ = auVar43;
              }
              lVar23 = 0;
              iVar34 = 0;
              while (iVar34 + 8 <= iVar31) {
                auVar84 = vfmadd132ps_fma(*pauVar37,auVar113,auVar137);
                *pauVar37 = ZEXT1632(auVar84);
                pauVar37 = pauVar37 + 1;
                lVar23 = lVar23 + 8;
                iVar34 = iVar34 + 8;
              }
              while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
                auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar37,auVar43,auVar83);
                *(undefined1 (*) [16])*pauVar37 = auVar84;
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
                lVar23 = lVar23 + 4;
              }
              for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
                auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar9 + lVar23 * 4 + lVar25)),
                                          auVar40,auVar41);
                *(int *)((long)pvVar9 + lVar23 * 4 + lVar25) = auVar83._0_4_;
              }
            }
            else {
              pauVar36 = pauVar8;
              pauVar32 = pauVar7;
              if (bVar21) {
                for (iVar34 = 8; iVar34 <= iVar31; iVar34 = iVar34 + 8) {
                  uVar2 = *(undefined4 *)*pauVar32;
                  auVar59._4_4_ = uVar2;
                  auVar59._0_4_ = uVar2;
                  auVar59._8_4_ = uVar2;
                  auVar59._12_4_ = uVar2;
                  auVar59._16_4_ = uVar2;
                  auVar59._20_4_ = uVar2;
                  auVar59._24_4_ = uVar2;
                  auVar59._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)*pauVar36;
                  auVar94._4_4_ = uVar2;
                  auVar94._0_4_ = uVar2;
                  auVar94._8_4_ = uVar2;
                  auVar94._12_4_ = uVar2;
                  auVar94._16_4_ = uVar2;
                  auVar94._20_4_ = uVar2;
                  auVar94._24_4_ = uVar2;
                  auVar94._28_4_ = uVar2;
                  auVar83 = vfmadd132ps_fma(*pauVar37,auVar113,auVar137);
                  auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar59,auVar94);
                  *pauVar37 = ZEXT1632(auVar83);
                  pauVar37 = pauVar37 + 1;
                  pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                  pauVar36 = (undefined1 (*) [32])(*pauVar36 + 4);
                }
              }
              if (bVar22) {
                auVar60._16_16_ = auVar41;
                auVar60._0_16_ = auVar41;
                auVar95._16_16_ = auVar40;
                auVar95._0_16_ = auVar40;
                pauVar28 = pauVar37;
                for (lVar23 = 0; (int)lVar23 + 8 <= iVar31; lVar23 = lVar23 + 8) {
                  uVar2 = *(undefined4 *)(*pauVar32 + lVar23 + 4);
                  auVar111._20_4_ = uVar2;
                  auVar111._16_4_ = uVar2;
                  auVar111._24_4_ = uVar2;
                  auVar111._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
                  auVar111._4_4_ = uVar2;
                  auVar111._0_4_ = uVar2;
                  auVar111._8_4_ = uVar2;
                  auVar111._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(*pauVar36 + lVar23 + 4);
                  auVar119._20_4_ = uVar2;
                  auVar119._16_4_ = uVar2;
                  auVar119._24_4_ = uVar2;
                  auVar119._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(*pauVar36 + lVar23);
                  auVar119._4_4_ = uVar2;
                  auVar119._0_4_ = uVar2;
                  auVar119._8_4_ = uVar2;
                  auVar119._12_4_ = uVar2;
                  auVar83 = vfmadd132ps_fma(*pauVar28,auVar95,auVar60);
                  auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar111,auVar119);
                  *pauVar28 = ZEXT1632(auVar83);
                  pauVar28 = pauVar28 + 1;
                }
                for (; (int)lVar23 + 4 <= iVar31; lVar23 = lVar23 + 4) {
                  uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
                  auVar51._4_4_ = uVar2;
                  auVar51._0_4_ = uVar2;
                  auVar51._8_4_ = uVar2;
                  auVar51._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(*pauVar36 + lVar23);
                  auVar82._4_4_ = uVar2;
                  auVar82._0_4_ = uVar2;
                  auVar82._8_4_ = uVar2;
                  auVar82._12_4_ = uVar2;
                  auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar37 + lVar23 * 4),auVar40,
                                            auVar41);
                  auVar83 = vfmadd213ps_fma(auVar83,auVar51,auVar82);
                  *(undefined1 (*) [16])(*pauVar37 + lVar23 * 4) = auVar83;
                  pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
                }
                pauVar36 = (undefined1 (*) [32])(*pauVar36 + lVar23);
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar23);
                pauVar37 = pauVar28;
              }
              if (bVar27) {
                auVar83 = vshufps_avx(auVar41,auVar41,0);
                auVar96._16_16_ = auVar83;
                auVar96._0_16_ = auVar83;
                auVar43 = vshufps_avx(auVar40,auVar40,0);
                auVar112._16_16_ = auVar43;
                auVar112._0_16_ = auVar43;
                lVar25 = 0;
                lVar23 = 0;
                pauVar28 = pauVar37;
                pauVar29 = pauVar36;
                pauVar35 = pauVar32;
                iVar34 = 0;
                while (iVar34 + 8 <= iVar31) {
                  auVar43 = vfmadd132ps_fma(*pauVar28,auVar112,auVar96);
                  auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),*pauVar35,*pauVar29);
                  *pauVar28 = ZEXT1632(auVar43);
                  pauVar28 = pauVar28 + 1;
                  pauVar35 = pauVar35 + 1;
                  pauVar29 = pauVar29 + 1;
                  lVar23 = lVar23 + 0x20;
                  lVar25 = lVar25 + 8;
                  iVar34 = iVar34 + 8;
                }
                auVar43 = vshufps_avx(auVar40,auVar40,0);
                while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
                  auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar37 + lVar23),auVar43,
                                            auVar83);
                  auVar84 = vfmadd213ps_fma(auVar84,*(undefined1 (*) [16])(*pauVar32 + lVar23),
                                            *(undefined1 (*) [16])(*pauVar36 + lVar23));
                  *(undefined1 (*) [16])(*pauVar37 + lVar23) = auVar84;
                  lVar23 = lVar23 + 0x10;
                  lVar25 = lVar25 + 4;
                }
                for (; (int)lVar25 < iVar31; lVar25 = lVar25 + 1) {
                  auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar37 + lVar25 * 4)),auVar40,
                                            auVar41);
                  auVar83 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar32 + lVar25 * 4)),auVar83,
                                            ZEXT416(*(uint *)(*pauVar36 + lVar25 * 4)));
                  *(int *)(*pauVar37 + lVar25 * 4) = auVar83._0_4_;
                }
              }
            }
          }
        }
      }
      else {
        iVar31 = uVar4 * iVar34 * iVar3;
        fVar39 = 1.0 / (float)(int)(uVar4 * iVar34);
        auVar42 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
        for (uVar26 = 0; uVar26 != uVar24; uVar26 = uVar26 + 1) {
          pvVar9 = bottom_top_blob->data;
          pauVar36 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize + (long)pvVar9);
          fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var5[-3]);
          lVar23 = 0;
          auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar37 = pauVar36;
          iVar34 = 0;
          while( true ) {
            auVar40._0_4_ = auVar65._0_4_;
            fVar66 = auVar65._4_4_;
            fVar68 = auVar65._8_4_;
            fVar67 = auVar65._12_4_;
            fVar69 = auVar65._16_4_;
            fVar70 = auVar65._20_4_;
            fVar71 = auVar65._24_4_;
            if (iVar31 < iVar34 + 8) break;
            auVar65 = ZEXT3264(CONCAT428(auVar65._28_4_ + *(float *)(*pauVar37 + 0x1c),
                                         CONCAT424(fVar71 + *(float *)(*pauVar37 + 0x18),
                                                   CONCAT420(fVar70 + *(float *)(*pauVar37 + 0x14),
                                                             CONCAT416(fVar69 + *(float *)(*pauVar37
                                                                                          + 0x10),
                                                                       CONCAT412(fVar67 + *(float *)
                                                  (*pauVar37 + 0xc),
                                                  CONCAT48(fVar68 + *(float *)(*pauVar37 + 8),
                                                           CONCAT44(fVar66 + *(float *)(*pauVar37 +
                                                                                       4),
                                                                    auVar40._0_4_ +
                                                                    *(float *)*pauVar37))))))));
            pauVar37 = pauVar37 + 1;
            lVar23 = lVar23 + 8;
            iVar34 = iVar34 + 8;
          }
          auVar83 = ZEXT816(0) << 0x40;
          while( true ) {
            iVar34 = iVar34 + 4;
            fVar72 = auVar83._0_4_;
            fVar11 = auVar83._4_4_;
            fVar12 = auVar83._8_4_;
            fVar13 = auVar83._12_4_;
            if (iVar31 < iVar34) break;
            auVar83._0_4_ = fVar72 + *(float *)*pauVar37;
            auVar83._4_4_ = fVar11 + *(float *)(*pauVar37 + 4);
            auVar83._8_4_ = fVar12 + *(float *)(*pauVar37 + 8);
            auVar83._12_4_ = fVar13 + *(float *)(*pauVar37 + 0xc);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            lVar23 = lVar23 + 4;
          }
          lVar25 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar26;
          fVar102 = 0.0;
          for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
            fVar102 = fVar102 + *(float *)((long)pvVar9 + lVar23 * 4 + lVar25);
          }
          fVar14 = auVar42._0_4_;
          fVar15 = auVar42._4_4_;
          fVar16 = auVar42._8_4_;
          fVar17 = auVar42._12_4_;
          if (iVar3 == 8) {
            auVar122._0_4_ = auVar40._0_4_ * fVar14;
            auVar122._4_4_ = fVar66 * fVar15;
            auVar122._8_4_ = fVar68 * fVar16;
            auVar127._12_4_ = fVar67 * fVar17;
            auVar127._0_12_ = auVar122;
            auVar65._16_4_ = fVar69 * fVar14;
            auVar65._0_16_ = auVar127;
            auVar65._20_4_ = fVar70 * fVar15;
            auVar65._28_36_ = in_ZMM12._28_36_;
            auVar65._24_4_ = fVar71 * fVar16;
            auVar98 = auVar65._0_32_;
            in_ZMM12 = ZEXT3264(auVar98);
            auVar135 = vshufps_avx(auVar127,auVar127,0);
            bVar22 = true;
            bVar21 = false;
            bVar27 = false;
          }
          else {
            if (iVar3 == 4) {
              auVar122._0_4_ = (fVar69 + auVar40._0_4_ + fVar72) * fVar14;
              auVar122._4_4_ = (fVar70 + fVar66 + fVar11) * fVar15;
              auVar122._8_4_ = (fVar71 + fVar68 + fVar12) * fVar16;
              auVar135._12_4_ = (auVar65._28_4_ + fVar67 + fVar13) * fVar17;
              auVar135._0_12_ = auVar122;
              bVar27 = true;
              bVar21 = false;
              auVar126 = auVar135;
            }
            else {
              if (iVar3 != 1) {
                auVar122 = SUB1612(ZEXT816(0),0) << 0x40;
                auVar126 = ZEXT816(0) << 0x40;
                auVar135 = ZEXT816(0) << 0x40;
              }
              else {
                auVar41 = vshufpd_avx(auVar83,auVar83,1);
                auVar40 = vhaddps_avx(auVar65._16_16_,auVar65._0_16_);
                auVar85._0_4_ = auVar41._0_4_ + fVar72;
                auVar85._4_4_ = auVar41._4_4_ + fVar11;
                auVar85._8_4_ = auVar41._8_4_ + fVar12;
                auVar85._12_4_ = auVar41._12_4_ + fVar13;
                auVar40 = vhaddps_avx(auVar40,auVar40);
                auVar41 = vmovshdup_avx(auVar85);
                auVar40 = vhaddps_avx(auVar40,auVar40);
                auVar40._0_4_ = (auVar40._0_4_ + auVar41._0_4_ + auVar85._0_4_ + fVar102) * fVar39;
                auVar122._4_8_ = 0;
                auVar122._0_4_ = auVar40._0_4_;
                auVar126._4_8_ = SUB128(ZEXT812(0),4);
                auVar126._0_4_ = auVar40._0_4_;
                auVar126._12_4_ = 0;
                auVar135 = vshufps_avx(ZEXT416((uint)auVar40._0_4_),ZEXT416((uint)auVar40._0_4_),0);
              }
              bVar21 = iVar3 == 1;
              bVar27 = false;
            }
            in_ZMM12 = ZEXT1664(auVar126);
            auVar98._16_16_ = auVar135;
            auVar98._0_16_ = auVar135;
            bVar22 = false;
          }
          lVar23 = 0;
          auVar41 = ZEXT816(0) << 0x40;
          pauVar37 = pauVar36;
          iVar34 = 0;
          while (iVar34 + 8 <= iVar31) {
            auVar97 = vsubps_avx(*pauVar37,auVar98);
            auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar97,auVar97);
            pauVar37 = pauVar37 + 1;
            lVar23 = lVar23 + 8;
            iVar34 = iVar34 + 8;
          }
          auVar86 = ZEXT816(0) << 0x20;
          while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
            auVar40 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar135);
            auVar86 = vfmadd231ps_fma(auVar86,auVar40,auVar40);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            lVar23 = lVar23 + 4;
          }
          auVar83 = ZEXT816(0) << 0x40;
          for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
            auVar40 = ZEXT416((uint)(*(float *)((long)pvVar9 + lVar23 * 4 + lVar25) - auVar122._0_4_
                                    ));
            auVar83 = vfmadd231ss_fma(auVar83,auVar40,auVar40);
          }
          if (bVar22) {
            auVar65 = ZEXT2864(CONCAT424(fVar16 * 0.0,
                                         CONCAT420(fVar15 * 0.0,
                                                   CONCAT416(fVar14 * 0.0,
                                                             CONCAT412(auVar41._12_4_ * fVar17,
                                                                       CONCAT48(auVar41._8_4_ *
                                                                                fVar16,CONCAT44(
                                                  auVar41._4_4_ * fVar15,auVar41._0_4_ * fVar14)))))
                                        ));
          }
          else {
            auVar65 = ZEXT1264(ZEXT812(0)) << 0x20;
          }
          if (bVar27) {
            auVar40._0_4_ = auVar86._4_4_;
            fVar66 = auVar86._8_4_;
            fVar68 = auVar86._12_4_;
            auVar86._0_4_ = auVar41._0_4_ + auVar86._0_4_ + 0.0;
            auVar86._4_4_ = auVar41._4_4_ + auVar40._0_4_ + 0.0;
            auVar86._8_4_ = auVar41._8_4_ + fVar66 + 0.0;
            auVar86._12_4_ = auVar41._12_4_ + fVar68 + 0.0;
            auVar97 = vblendps_avx(auVar65._0_32_,
                                   ZEXT1632(CONCAT412(auVar86._12_4_ * fVar17,
                                                      CONCAT48(auVar86._8_4_ * fVar16,
                                                               CONCAT44(auVar86._4_4_ * fVar15,
                                                                        auVar86._0_4_ * fVar14)))),
                                   0xf);
            auVar65 = ZEXT3264(auVar97);
          }
          if (bVar21) {
            auVar40 = vshufpd_avx(auVar86,auVar86,1);
            auVar87._0_4_ = auVar40._0_4_ + auVar86._0_4_;
            auVar87._4_4_ = auVar40._4_4_ + auVar86._4_4_;
            auVar87._8_4_ = auVar40._8_4_ + auVar86._8_4_;
            auVar87._12_4_ = auVar40._12_4_ + auVar86._12_4_;
            auVar40 = vhaddps_avx((undefined1  [16])0x0,auVar41);
            auVar41 = vmovshdup_avx(auVar87);
            auVar40 = vhaddps_avx(auVar40,auVar40);
            auVar40 = vhaddps_avx(auVar40,auVar40);
            auVar97 = vblendps_avx(auVar65._0_32_,
                                   ZEXT432((uint)((auVar40._0_4_ +
                                                  auVar83._0_4_ + auVar41._0_4_ + auVar87._0_4_) *
                                                 fVar39)),1);
            auVar65 = ZEXT3264(auVar97);
          }
          auVar40._0_4_ = auVar65._0_4_;
          auVar138 = auVar65._0_32_;
          if (iVar3 == 1) {
            auVar40._0_4_ = auVar40._0_4_ + fVar45;
            auVar41 = vrsqrtss_avx(ZEXT416((uint)auVar40._0_4_),ZEXT416((uint)auVar40._0_4_));
            auVar40 = vfmadd213ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar41._0_4_)),auVar41,
                                      ZEXT416(0xc0400000));
            fVar45 = auVar41._0_4_ * -0.5 * auVar40._0_4_;
            auVar138 = vblendps_avx(auVar138,ZEXT432((uint)fVar45),1);
            auVar97 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar45 * -auVar122._0_4_)),1);
            in_ZMM12 = ZEXT3264(auVar97);
          }
          else if (iVar3 == 4) {
            auVar41 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
            auVar52._0_4_ = auVar40._0_4_ + auVar41._0_4_;
            auVar52._4_4_ = auVar65._4_4_ + auVar41._4_4_;
            auVar52._8_4_ = auVar65._8_4_ + auVar41._8_4_;
            auVar52._12_4_ = auVar65._12_4_ + auVar41._12_4_;
            auVar41 = vrsqrtps_avx(auVar52);
            auVar53._0_4_ = auVar52._0_4_ * auVar41._0_4_;
            auVar53._4_4_ = auVar52._4_4_ * auVar41._4_4_;
            auVar53._8_4_ = auVar52._8_4_ * auVar41._8_4_;
            auVar53._12_4_ = auVar52._12_4_ * auVar41._12_4_;
            auVar105._8_4_ = 0xc0400000;
            auVar105._0_8_ = 0xc0400000c0400000;
            auVar105._12_4_ = 0xc0400000;
            auVar83 = vfmadd213ps_fma(auVar53,auVar41,auVar105);
            fVar45 = auVar41._0_4_ * -0.5 * auVar83._0_4_;
            auVar40._0_4_ = auVar41._4_4_ * -0.5 * auVar83._4_4_;
            fVar66 = auVar41._8_4_ * -0.5 * auVar83._8_4_;
            fVar68 = auVar41._12_4_ * -0.5 * auVar83._12_4_;
            auVar138 = vblendps_avx(auVar138,ZEXT1632(CONCAT412(fVar68,CONCAT48(fVar66,CONCAT44(
                                                  auVar40._0_4_,fVar45)))),0xf);
            auVar97 = vblendps_avx(in_ZMM12._0_32_,
                                   ZEXT1632(CONCAT412(fVar68 * -in_ZMM12._12_4_,
                                                      CONCAT48(fVar66 * -in_ZMM12._8_4_,
                                                               CONCAT44(auVar40._0_4_ *
                                                                        -in_ZMM12._4_4_,
                                                                        fVar45 * -in_ZMM12._0_4_))))
                                   ,0xf);
            in_ZMM12 = ZEXT3264(auVar97);
          }
          else if (iVar3 == 8) {
            auVar41 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
            auVar62._0_4_ = auVar40._0_4_ + auVar41._0_4_;
            auVar62._4_4_ = auVar65._4_4_ + auVar41._4_4_;
            auVar62._8_4_ = auVar65._8_4_ + auVar41._8_4_;
            auVar62._12_4_ = auVar65._12_4_ + auVar41._12_4_;
            auVar62._16_4_ = auVar65._16_4_ + auVar41._0_4_;
            auVar62._20_4_ = auVar65._20_4_ + auVar41._4_4_;
            auVar62._24_4_ = auVar65._24_4_ + auVar41._8_4_;
            auVar62._28_4_ = auVar65._28_4_ + auVar41._12_4_;
            auVar97 = vrsqrtps_avx(auVar62);
            auVar20._4_4_ = auVar62._4_4_ * auVar97._4_4_;
            auVar20._0_4_ = auVar62._0_4_ * auVar97._0_4_;
            auVar20._8_4_ = auVar62._8_4_ * auVar97._8_4_;
            auVar20._12_4_ = auVar62._12_4_ * auVar97._12_4_;
            auVar20._16_4_ = auVar62._16_4_ * auVar97._16_4_;
            auVar20._20_4_ = auVar62._20_4_ * auVar97._20_4_;
            auVar20._24_4_ = auVar62._24_4_ * auVar97._24_4_;
            auVar20._28_4_ = auVar62._28_4_;
            auVar114._8_4_ = 0xc0400000;
            auVar114._0_8_ = 0xc0400000c0400000;
            auVar114._12_4_ = 0xc0400000;
            auVar114._16_4_ = 0xc0400000;
            auVar114._20_4_ = 0xc0400000;
            auVar114._24_4_ = 0xc0400000;
            auVar114._28_4_ = 0xc0400000;
            auVar40 = vfmadd213ps_fma(auVar20,auVar97,auVar114);
            auVar141._0_4_ = auVar97._0_4_ * -0.5 * auVar40._0_4_;
            auVar141._4_4_ = auVar97._4_4_ * -0.5 * auVar40._4_4_;
            auVar141._8_4_ = auVar97._8_4_ * -0.5 * auVar40._8_4_;
            auVar141._12_4_ = auVar97._12_4_ * -0.5 * auVar40._12_4_;
            auVar141._16_4_ = auVar97._16_4_ * -0.5 * 0.0;
            auVar141._20_4_ = auVar97._20_4_ * -0.5 * 0.0;
            auVar141._28_36_ = auVar65._28_36_;
            auVar141._24_4_ = auVar97._24_4_ * -0.5 * 0.0;
            auVar138 = auVar141._0_32_;
            auVar132._0_4_ = auVar141._0_4_ * -in_ZMM12._0_4_;
            auVar132._4_4_ = auVar141._4_4_ * -in_ZMM12._4_4_;
            auVar132._8_4_ = auVar141._8_4_ * -in_ZMM12._8_4_;
            auVar132._12_4_ = auVar141._12_4_ * -in_ZMM12._12_4_;
            auVar132._16_4_ = auVar141._16_4_ * -in_ZMM12._16_4_;
            auVar132._20_4_ = auVar141._20_4_ * -in_ZMM12._20_4_;
            auVar132._28_36_ = in_ZMM12._28_36_;
            auVar132._24_4_ = auVar141._24_4_ * -in_ZMM12._24_4_;
            in_ZMM12 = ZEXT3264(auVar132._0_32_);
          }
          auVar117 = in_ZMM12._0_32_;
          auVar41 = auVar138._0_16_;
          auVar40 = in_ZMM12._0_16_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
            auVar83 = auVar41;
            auVar43 = auVar40;
            if (!bVar27) {
              auVar83 = vshufps_avx(auVar41,auVar41,0);
              auVar43 = vshufps_avx(auVar40,auVar40,0);
            }
            if (!bVar22) {
              auVar138._16_16_ = auVar83;
              auVar138._0_16_ = auVar83;
              auVar117._16_16_ = auVar43;
              auVar117._0_16_ = auVar43;
            }
            lVar23 = 0;
            iVar34 = 0;
            while (iVar34 + 8 <= iVar31) {
              auVar84 = vfmadd132ps_fma(*pauVar36,auVar117,auVar138);
              *pauVar36 = ZEXT1632(auVar84);
              pauVar36 = pauVar36 + 1;
              lVar23 = lVar23 + 8;
              iVar34 = iVar34 + 8;
            }
            while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
              auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar36,auVar43,auVar83);
              *(undefined1 (*) [16])*pauVar36 = auVar84;
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              lVar23 = lVar23 + 4;
            }
            for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
              auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar9 + lVar23 * 4 + lVar25)),
                                        auVar40,auVar41);
              *(int *)((long)pvVar9 + lVar23 * 4 + lVar25) = auVar83._0_4_;
            }
          }
          else {
            pauVar37 = pauVar8;
            pauVar32 = pauVar7;
            if (bVar22) {
              for (iVar34 = 8; iVar34 <= iVar31; iVar34 = iVar34 + 8) {
                uVar2 = *(undefined4 *)*pauVar32;
                auVar63._4_4_ = uVar2;
                auVar63._0_4_ = uVar2;
                auVar63._8_4_ = uVar2;
                auVar63._12_4_ = uVar2;
                auVar63._16_4_ = uVar2;
                auVar63._20_4_ = uVar2;
                auVar63._24_4_ = uVar2;
                auVar63._28_4_ = uVar2;
                uVar2 = *(undefined4 *)*pauVar37;
                auVar99._4_4_ = uVar2;
                auVar99._0_4_ = uVar2;
                auVar99._8_4_ = uVar2;
                auVar99._12_4_ = uVar2;
                auVar99._16_4_ = uVar2;
                auVar99._20_4_ = uVar2;
                auVar99._24_4_ = uVar2;
                auVar99._28_4_ = uVar2;
                auVar83 = vfmadd132ps_fma(*pauVar36,auVar117,auVar138);
                auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar63,auVar99);
                *pauVar36 = ZEXT1632(auVar83);
                pauVar36 = pauVar36 + 1;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              }
            }
            if (bVar27) {
              auVar64._16_16_ = auVar41;
              auVar64._0_16_ = auVar41;
              auVar100._16_16_ = auVar40;
              auVar100._0_16_ = auVar40;
              pauVar28 = pauVar36;
              for (lVar23 = 0; (int)lVar23 + 8 <= iVar31; lVar23 = lVar23 + 8) {
                uVar2 = *(undefined4 *)(*pauVar32 + lVar23 + 4);
                auVar115._20_4_ = uVar2;
                auVar115._16_4_ = uVar2;
                auVar115._24_4_ = uVar2;
                auVar115._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
                auVar115._4_4_ = uVar2;
                auVar115._0_4_ = uVar2;
                auVar115._8_4_ = uVar2;
                auVar115._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar37 + lVar23 + 4);
                auVar120._20_4_ = uVar2;
                auVar120._16_4_ = uVar2;
                auVar120._24_4_ = uVar2;
                auVar120._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar37 + lVar23);
                auVar120._4_4_ = uVar2;
                auVar120._0_4_ = uVar2;
                auVar120._8_4_ = uVar2;
                auVar120._12_4_ = uVar2;
                auVar83 = vfmadd132ps_fma(*pauVar28,auVar100,auVar64);
                auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar115,auVar120);
                *pauVar28 = ZEXT1632(auVar83);
                pauVar28 = pauVar28 + 1;
              }
              for (; (int)lVar23 + 4 <= iVar31; lVar23 = lVar23 + 4) {
                uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
                auVar54._4_4_ = uVar2;
                auVar54._0_4_ = uVar2;
                auVar54._8_4_ = uVar2;
                auVar54._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar37 + lVar23);
                auVar88._4_4_ = uVar2;
                auVar88._0_4_ = uVar2;
                auVar88._8_4_ = uVar2;
                auVar88._12_4_ = uVar2;
                auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar36 + lVar23 * 4),auVar40,
                                          auVar41);
                auVar83 = vfmadd213ps_fma(auVar83,auVar54,auVar88);
                *(undefined1 (*) [16])(*pauVar36 + lVar23 * 4) = auVar83;
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
              }
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar23);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar23);
              pauVar36 = pauVar28;
            }
            if (bVar21) {
              auVar83 = vshufps_avx(auVar41,auVar41,0);
              auVar101._16_16_ = auVar83;
              auVar101._0_16_ = auVar83;
              auVar43 = vshufps_avx(auVar40,auVar40,0);
              auVar116._16_16_ = auVar43;
              auVar116._0_16_ = auVar43;
              lVar25 = 0;
              lVar23 = 0;
              pauVar28 = pauVar36;
              pauVar29 = pauVar37;
              pauVar35 = pauVar32;
              iVar34 = 0;
              while (iVar34 + 8 <= iVar31) {
                auVar43 = vfmadd132ps_fma(*pauVar28,auVar116,auVar101);
                auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),*pauVar35,*pauVar29);
                *pauVar28 = ZEXT1632(auVar43);
                pauVar28 = pauVar28 + 1;
                pauVar35 = pauVar35 + 1;
                pauVar29 = pauVar29 + 1;
                lVar23 = lVar23 + 0x20;
                lVar25 = lVar25 + 8;
                iVar34 = iVar34 + 8;
              }
              auVar43 = vshufps_avx(auVar40,auVar40,0);
              while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
                auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar36 + lVar23),auVar43,auVar83
                                         );
                auVar84 = vfmadd213ps_fma(auVar84,*(undefined1 (*) [16])(*pauVar32 + lVar23),
                                          *(undefined1 (*) [16])(*pauVar37 + lVar23));
                *(undefined1 (*) [16])(*pauVar36 + lVar23) = auVar84;
                lVar23 = lVar23 + 0x10;
                lVar25 = lVar25 + 4;
              }
              for (; (int)lVar25 < iVar31; lVar25 = lVar25 + 1) {
                auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar36 + lVar25 * 4)),auVar40,auVar41
                                         );
                auVar83 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar32 + lVar25 * 4)),auVar83,
                                          ZEXT416(*(uint *)(*pauVar37 + lVar25 * 4)));
                *(int *)(*pauVar36 + lVar25 * 4) = auVar83._0_4_;
              }
            }
          }
        }
      }
    }
    else if (iVar31 == 2) {
      iVar31 = iVar34 * iVar3;
      fVar39 = 1.0 / (float)iVar34;
      auVar42 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
      uVar26 = 0;
      uVar24 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar24 = uVar26;
      }
      for (; uVar26 != uVar24; uVar26 = uVar26 + 1) {
        pvVar9 = bottom_top_blob->data;
        pauVar36 = (undefined1 (*) [32])
                   (uVar26 * (long)bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar9);
        fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var5[-3]);
        lVar23 = 0;
        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar37 = pauVar36;
        iVar34 = 0;
        while( true ) {
          auVar40._0_4_ = auVar65._0_4_;
          fVar66 = auVar65._4_4_;
          fVar68 = auVar65._8_4_;
          fVar67 = auVar65._12_4_;
          fVar69 = auVar65._16_4_;
          fVar70 = auVar65._20_4_;
          fVar71 = auVar65._24_4_;
          if (iVar31 < iVar34 + 8) break;
          auVar65 = ZEXT3264(CONCAT428(auVar65._28_4_ + *(float *)(*pauVar37 + 0x1c),
                                       CONCAT424(fVar71 + *(float *)(*pauVar37 + 0x18),
                                                 CONCAT420(fVar70 + *(float *)(*pauVar37 + 0x14),
                                                           CONCAT416(fVar69 + *(float *)(*pauVar37 +
                                                                                        0x10),
                                                                     CONCAT412(fVar67 + *(float *)(*
                                                  pauVar37 + 0xc),
                                                  CONCAT48(fVar68 + *(float *)(*pauVar37 + 8),
                                                           CONCAT44(fVar66 + *(float *)(*pauVar37 +
                                                                                       4),
                                                                    auVar40._0_4_ +
                                                                    *(float *)*pauVar37))))))));
          pauVar37 = pauVar37 + 1;
          lVar23 = lVar23 + 8;
          iVar34 = iVar34 + 8;
        }
        auVar73 = ZEXT816(0) << 0x40;
        while( true ) {
          iVar34 = iVar34 + 4;
          fVar72 = auVar73._0_4_;
          fVar11 = auVar73._4_4_;
          fVar12 = auVar73._8_4_;
          fVar13 = auVar73._12_4_;
          if (iVar31 < iVar34) break;
          auVar73._0_4_ = fVar72 + *(float *)*pauVar37;
          auVar73._4_4_ = fVar11 + *(float *)(*pauVar37 + 4);
          auVar73._8_4_ = fVar12 + *(float *)(*pauVar37 + 8);
          auVar73._12_4_ = fVar13 + *(float *)(*pauVar37 + 0xc);
          pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
          lVar23 = lVar23 + 4;
        }
        lVar25 = bottom_top_blob->elemsize * uVar26 * (long)bottom_top_blob->w;
        fVar102 = 0.0;
        for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
          fVar102 = fVar102 + *(float *)((long)pvVar9 + lVar23 * 4 + lVar25);
        }
        fVar14 = auVar42._0_4_;
        fVar15 = auVar42._4_4_;
        fVar16 = auVar42._8_4_;
        fVar17 = auVar42._12_4_;
        if (iVar3 == 8) {
          auVar121._0_4_ = auVar40._0_4_ * fVar14;
          auVar121._4_4_ = fVar66 * fVar15;
          auVar121._8_4_ = fVar68 * fVar16;
          auVar124._12_4_ = fVar67 * fVar17;
          auVar124._0_12_ = auVar121;
          auVar128._16_4_ = fVar69 * fVar14;
          auVar128._0_16_ = auVar124;
          auVar128._20_4_ = fVar70 * fVar15;
          auVar128._28_36_ = in_ZMM12._28_36_;
          auVar128._24_4_ = fVar71 * fVar16;
          auVar89 = auVar128._0_32_;
          in_ZMM12 = ZEXT3264(auVar89);
          auVar133 = vshufps_avx(auVar124,auVar124,0);
          bVar22 = true;
          bVar21 = false;
          bVar27 = false;
        }
        else {
          if (iVar3 == 4) {
            auVar121._0_4_ = (fVar69 + auVar40._0_4_ + fVar72) * fVar14;
            auVar121._4_4_ = (fVar70 + fVar66 + fVar11) * fVar15;
            auVar121._8_4_ = (fVar71 + fVar68 + fVar12) * fVar16;
            auVar133._12_4_ = (auVar65._28_4_ + fVar67 + fVar13) * fVar17;
            auVar133._0_12_ = auVar121;
            bVar27 = true;
            bVar21 = false;
            auVar123 = auVar133;
          }
          else {
            if (iVar3 != 1) {
              auVar121 = SUB1612(ZEXT816(0),0) << 0x40;
              auVar123 = ZEXT816(0) << 0x40;
              auVar133 = ZEXT816(0) << 0x40;
            }
            else {
              auVar41 = vshufpd_avx(auVar73,auVar73,1);
              auVar40 = vhaddps_avx(auVar65._16_16_,auVar65._0_16_);
              auVar74._0_4_ = auVar41._0_4_ + fVar72;
              auVar74._4_4_ = auVar41._4_4_ + fVar11;
              auVar74._8_4_ = auVar41._8_4_ + fVar12;
              auVar74._12_4_ = auVar41._12_4_ + fVar13;
              auVar40 = vhaddps_avx(auVar40,auVar40);
              auVar41 = vmovshdup_avx(auVar74);
              auVar40 = vhaddps_avx(auVar40,auVar40);
              auVar40._0_4_ = (auVar40._0_4_ + auVar41._0_4_ + auVar74._0_4_ + fVar102) * fVar39;
              auVar121._4_8_ = 0;
              auVar121._0_4_ = auVar40._0_4_;
              auVar123._4_8_ = SUB128(ZEXT812(0),4);
              auVar123._0_4_ = auVar40._0_4_;
              auVar123._12_4_ = 0;
              auVar133 = vshufps_avx(ZEXT416((uint)auVar40._0_4_),ZEXT416((uint)auVar40._0_4_),0);
            }
            bVar21 = iVar3 == 1;
            bVar27 = false;
          }
          in_ZMM12 = ZEXT1664(auVar123);
          auVar89._16_16_ = auVar133;
          auVar89._0_16_ = auVar133;
          bVar22 = false;
        }
        lVar23 = 0;
        auVar41 = ZEXT816(0) << 0x40;
        pauVar37 = pauVar36;
        iVar34 = 0;
        while (iVar34 + 8 <= iVar31) {
          auVar97 = vsubps_avx(*pauVar37,auVar89);
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar97,auVar97);
          pauVar37 = pauVar37 + 1;
          lVar23 = lVar23 + 8;
          iVar34 = iVar34 + 8;
        }
        auVar75 = ZEXT816(0) << 0x20;
        while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
          auVar40 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar133);
          auVar75 = vfmadd231ps_fma(auVar75,auVar40,auVar40);
          pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
          lVar23 = lVar23 + 4;
        }
        auVar83 = ZEXT816(0) << 0x40;
        for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
          auVar40 = ZEXT416((uint)(*(float *)((long)pvVar9 + lVar23 * 4 + lVar25) - auVar121._0_4_))
          ;
          auVar83 = vfmadd231ss_fma(auVar83,auVar40,auVar40);
        }
        if (bVar22) {
          auVar65 = ZEXT2864(CONCAT424(fVar16 * 0.0,
                                       CONCAT420(fVar15 * 0.0,
                                                 CONCAT416(fVar14 * 0.0,
                                                           CONCAT412(auVar41._12_4_ * fVar17,
                                                                     CONCAT48(auVar41._8_4_ * fVar16
                                                                              ,CONCAT44(auVar41.
                                                  _4_4_ * fVar15,auVar41._0_4_ * fVar14)))))));
        }
        else {
          auVar65 = ZEXT1264(ZEXT812(0)) << 0x20;
        }
        if (bVar27) {
          auVar40._0_4_ = auVar75._4_4_;
          fVar66 = auVar75._8_4_;
          fVar68 = auVar75._12_4_;
          auVar75._0_4_ = auVar41._0_4_ + auVar75._0_4_ + 0.0;
          auVar75._4_4_ = auVar41._4_4_ + auVar40._0_4_ + 0.0;
          auVar75._8_4_ = auVar41._8_4_ + fVar66 + 0.0;
          auVar75._12_4_ = auVar41._12_4_ + fVar68 + 0.0;
          auVar97 = vblendps_avx(auVar65._0_32_,
                                 ZEXT1632(CONCAT412(auVar75._12_4_ * fVar17,
                                                    CONCAT48(auVar75._8_4_ * fVar16,
                                                             CONCAT44(auVar75._4_4_ * fVar15,
                                                                      auVar75._0_4_ * fVar14)))),0xf
                                );
          auVar65 = ZEXT3264(auVar97);
        }
        if (bVar21) {
          auVar40 = vshufpd_avx(auVar75,auVar75,1);
          auVar76._0_4_ = auVar40._0_4_ + auVar75._0_4_;
          auVar76._4_4_ = auVar40._4_4_ + auVar75._4_4_;
          auVar76._8_4_ = auVar40._8_4_ + auVar75._8_4_;
          auVar76._12_4_ = auVar40._12_4_ + auVar75._12_4_;
          auVar40 = vhaddps_avx((undefined1  [16])0x0,auVar41);
          auVar41 = vmovshdup_avx(auVar76);
          auVar40 = vhaddps_avx(auVar40,auVar40);
          auVar40 = vhaddps_avx(auVar40,auVar40);
          auVar97 = vblendps_avx(auVar65._0_32_,
                                 ZEXT432((uint)((auVar40._0_4_ +
                                                auVar83._0_4_ + auVar41._0_4_ + auVar76._0_4_) *
                                               fVar39)),1);
          auVar65 = ZEXT3264(auVar97);
        }
        auVar40._0_4_ = auVar65._0_4_;
        auVar136 = auVar65._0_32_;
        if (iVar3 == 1) {
          auVar40._0_4_ = auVar40._0_4_ + fVar45;
          auVar41 = vrsqrtss_avx(ZEXT416((uint)auVar40._0_4_),ZEXT416((uint)auVar40._0_4_));
          auVar40 = vfmadd213ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar41._0_4_)),auVar41,
                                    ZEXT416(0xc0400000));
          fVar45 = auVar41._0_4_ * -0.5 * auVar40._0_4_;
          auVar136 = vblendps_avx(auVar136,ZEXT432((uint)fVar45),1);
          auVar97 = vblendps_avx(in_ZMM12._0_32_,ZEXT432((uint)(fVar45 * -auVar121._0_4_)),1);
          in_ZMM12 = ZEXT3264(auVar97);
        }
        else if (iVar3 == 4) {
          auVar41 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
          auVar46._0_4_ = auVar40._0_4_ + auVar41._0_4_;
          auVar46._4_4_ = auVar65._4_4_ + auVar41._4_4_;
          auVar46._8_4_ = auVar65._8_4_ + auVar41._8_4_;
          auVar46._12_4_ = auVar65._12_4_ + auVar41._12_4_;
          auVar41 = vrsqrtps_avx(auVar46);
          auVar47._0_4_ = auVar46._0_4_ * auVar41._0_4_;
          auVar47._4_4_ = auVar46._4_4_ * auVar41._4_4_;
          auVar47._8_4_ = auVar46._8_4_ * auVar41._8_4_;
          auVar47._12_4_ = auVar46._12_4_ * auVar41._12_4_;
          auVar103._8_4_ = 0xc0400000;
          auVar103._0_8_ = 0xc0400000c0400000;
          auVar103._12_4_ = 0xc0400000;
          auVar83 = vfmadd213ps_fma(auVar47,auVar41,auVar103);
          fVar45 = auVar41._0_4_ * -0.5 * auVar83._0_4_;
          auVar40._0_4_ = auVar41._4_4_ * -0.5 * auVar83._4_4_;
          fVar66 = auVar41._8_4_ * -0.5 * auVar83._8_4_;
          fVar68 = auVar41._12_4_ * -0.5 * auVar83._12_4_;
          auVar136 = vblendps_avx(auVar136,ZEXT1632(CONCAT412(fVar68,CONCAT48(fVar66,CONCAT44(
                                                  auVar40._0_4_,fVar45)))),0xf);
          auVar97 = vblendps_avx(in_ZMM12._0_32_,
                                 ZEXT1632(CONCAT412(fVar68 * -in_ZMM12._12_4_,
                                                    CONCAT48(fVar66 * -in_ZMM12._8_4_,
                                                             CONCAT44(auVar40._0_4_ *
                                                                      -in_ZMM12._4_4_,
                                                                      fVar45 * -in_ZMM12._0_4_)))),
                                 0xf);
          in_ZMM12 = ZEXT3264(auVar97);
        }
        else if (iVar3 == 8) {
          auVar41 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
          auVar55._0_4_ = auVar40._0_4_ + auVar41._0_4_;
          auVar55._4_4_ = auVar65._4_4_ + auVar41._4_4_;
          auVar55._8_4_ = auVar65._8_4_ + auVar41._8_4_;
          auVar55._12_4_ = auVar65._12_4_ + auVar41._12_4_;
          auVar55._16_4_ = auVar65._16_4_ + auVar41._0_4_;
          auVar55._20_4_ = auVar65._20_4_ + auVar41._4_4_;
          auVar55._24_4_ = auVar65._24_4_ + auVar41._8_4_;
          auVar55._28_4_ = auVar65._28_4_ + auVar41._12_4_;
          auVar97 = vrsqrtps_avx(auVar55);
          auVar18._4_4_ = auVar55._4_4_ * auVar97._4_4_;
          auVar18._0_4_ = auVar55._0_4_ * auVar97._0_4_;
          auVar18._8_4_ = auVar55._8_4_ * auVar97._8_4_;
          auVar18._12_4_ = auVar55._12_4_ * auVar97._12_4_;
          auVar18._16_4_ = auVar55._16_4_ * auVar97._16_4_;
          auVar18._20_4_ = auVar55._20_4_ * auVar97._20_4_;
          auVar18._24_4_ = auVar55._24_4_ * auVar97._24_4_;
          auVar18._28_4_ = auVar55._28_4_;
          auVar106._8_4_ = 0xc0400000;
          auVar106._0_8_ = 0xc0400000c0400000;
          auVar106._12_4_ = 0xc0400000;
          auVar106._16_4_ = 0xc0400000;
          auVar106._20_4_ = 0xc0400000;
          auVar106._24_4_ = 0xc0400000;
          auVar106._28_4_ = 0xc0400000;
          auVar40 = vfmadd213ps_fma(auVar18,auVar97,auVar106);
          auVar139._0_4_ = auVar97._0_4_ * -0.5 * auVar40._0_4_;
          auVar139._4_4_ = auVar97._4_4_ * -0.5 * auVar40._4_4_;
          auVar139._8_4_ = auVar97._8_4_ * -0.5 * auVar40._8_4_;
          auVar139._12_4_ = auVar97._12_4_ * -0.5 * auVar40._12_4_;
          auVar139._16_4_ = auVar97._16_4_ * -0.5 * 0.0;
          auVar139._20_4_ = auVar97._20_4_ * -0.5 * 0.0;
          auVar139._28_36_ = auVar65._28_36_;
          auVar139._24_4_ = auVar97._24_4_ * -0.5 * 0.0;
          auVar136 = auVar139._0_32_;
          auVar129._0_4_ = auVar139._0_4_ * -in_ZMM12._0_4_;
          auVar129._4_4_ = auVar139._4_4_ * -in_ZMM12._4_4_;
          auVar129._8_4_ = auVar139._8_4_ * -in_ZMM12._8_4_;
          auVar129._12_4_ = auVar139._12_4_ * -in_ZMM12._12_4_;
          auVar129._16_4_ = auVar139._16_4_ * -in_ZMM12._16_4_;
          auVar129._20_4_ = auVar139._20_4_ * -in_ZMM12._20_4_;
          auVar129._28_36_ = in_ZMM12._28_36_;
          auVar129._24_4_ = auVar139._24_4_ * -in_ZMM12._24_4_;
          in_ZMM12 = ZEXT3264(auVar129._0_32_);
        }
        auVar109 = in_ZMM12._0_32_;
        auVar41 = auVar136._0_16_;
        auVar40 = in_ZMM12._0_16_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
          auVar83 = auVar41;
          auVar43 = auVar40;
          if (!bVar27) {
            auVar83 = vshufps_avx(auVar41,auVar41,0);
            auVar43 = vshufps_avx(auVar40,auVar40,0);
          }
          if (!bVar22) {
            auVar136._16_16_ = auVar83;
            auVar136._0_16_ = auVar83;
            auVar109._16_16_ = auVar43;
            auVar109._0_16_ = auVar43;
          }
          lVar23 = 0;
          iVar34 = 0;
          while (iVar34 + 8 <= iVar31) {
            auVar84 = vfmadd132ps_fma(*pauVar36,auVar109,auVar136);
            *pauVar36 = ZEXT1632(auVar84);
            pauVar36 = pauVar36 + 1;
            lVar23 = lVar23 + 8;
            iVar34 = iVar34 + 8;
          }
          while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
            auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar36,auVar43,auVar83);
            *(undefined1 (*) [16])*pauVar36 = auVar84;
            pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
            lVar23 = lVar23 + 4;
          }
          for (; (int)lVar23 < iVar31; lVar23 = lVar23 + 1) {
            auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar9 + lVar23 * 4 + lVar25)),auVar40
                                      ,auVar41);
            *(int *)((long)pvVar9 + lVar23 * 4 + lVar25) = auVar83._0_4_;
          }
        }
        else {
          pauVar37 = pauVar8;
          pauVar32 = pauVar7;
          if (bVar22) {
            for (iVar34 = 8; iVar34 <= iVar31; iVar34 = iVar34 + 8) {
              uVar2 = *(undefined4 *)*pauVar32;
              auVar56._4_4_ = uVar2;
              auVar56._0_4_ = uVar2;
              auVar56._8_4_ = uVar2;
              auVar56._12_4_ = uVar2;
              auVar56._16_4_ = uVar2;
              auVar56._20_4_ = uVar2;
              auVar56._24_4_ = uVar2;
              auVar56._28_4_ = uVar2;
              uVar2 = *(undefined4 *)*pauVar37;
              auVar90._4_4_ = uVar2;
              auVar90._0_4_ = uVar2;
              auVar90._8_4_ = uVar2;
              auVar90._12_4_ = uVar2;
              auVar90._16_4_ = uVar2;
              auVar90._20_4_ = uVar2;
              auVar90._24_4_ = uVar2;
              auVar90._28_4_ = uVar2;
              auVar83 = vfmadd132ps_fma(*pauVar36,auVar109,auVar136);
              auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar56,auVar90);
              *pauVar36 = ZEXT1632(auVar83);
              pauVar36 = pauVar36 + 1;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
            }
          }
          if (bVar27) {
            auVar57._16_16_ = auVar41;
            auVar57._0_16_ = auVar41;
            auVar91._16_16_ = auVar40;
            auVar91._0_16_ = auVar40;
            pauVar28 = pauVar36;
            for (lVar23 = 0; (int)lVar23 + 8 <= iVar31; lVar23 = lVar23 + 8) {
              uVar2 = *(undefined4 *)(*pauVar32 + lVar23 + 4);
              auVar107._20_4_ = uVar2;
              auVar107._16_4_ = uVar2;
              auVar107._24_4_ = uVar2;
              auVar107._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
              auVar107._4_4_ = uVar2;
              auVar107._0_4_ = uVar2;
              auVar107._8_4_ = uVar2;
              auVar107._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar37 + lVar23 + 4);
              auVar118._20_4_ = uVar2;
              auVar118._16_4_ = uVar2;
              auVar118._24_4_ = uVar2;
              auVar118._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar37 + lVar23);
              auVar118._4_4_ = uVar2;
              auVar118._0_4_ = uVar2;
              auVar118._8_4_ = uVar2;
              auVar118._12_4_ = uVar2;
              auVar83 = vfmadd132ps_fma(*pauVar28,auVar91,auVar57);
              auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar107,auVar118);
              *pauVar28 = ZEXT1632(auVar83);
              pauVar28 = pauVar28 + 1;
            }
            for (; (int)lVar23 + 4 <= iVar31; lVar23 = lVar23 + 4) {
              uVar2 = *(undefined4 *)(*pauVar32 + lVar23);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar37 + lVar23);
              auVar77._4_4_ = uVar2;
              auVar77._0_4_ = uVar2;
              auVar77._8_4_ = uVar2;
              auVar77._12_4_ = uVar2;
              auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar36 + lVar23 * 4),auVar40,
                                        auVar41);
              auVar83 = vfmadd213ps_fma(auVar83,auVar48,auVar77);
              *(undefined1 (*) [16])(*pauVar36 + lVar23 * 4) = auVar83;
              pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
            }
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar23);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar23);
            pauVar36 = pauVar28;
          }
          if (bVar21) {
            auVar83 = vshufps_avx(auVar41,auVar41,0);
            auVar92._16_16_ = auVar83;
            auVar92._0_16_ = auVar83;
            auVar43 = vshufps_avx(auVar40,auVar40,0);
            auVar108._16_16_ = auVar43;
            auVar108._0_16_ = auVar43;
            lVar25 = 0;
            lVar23 = 0;
            pauVar28 = pauVar36;
            pauVar29 = pauVar37;
            pauVar35 = pauVar32;
            iVar34 = 0;
            while (iVar34 + 8 <= iVar31) {
              auVar43 = vfmadd132ps_fma(*pauVar28,auVar108,auVar92);
              auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),*pauVar35,*pauVar29);
              *pauVar28 = ZEXT1632(auVar43);
              pauVar28 = pauVar28 + 1;
              pauVar35 = pauVar35 + 1;
              pauVar29 = pauVar29 + 1;
              lVar23 = lVar23 + 0x20;
              lVar25 = lVar25 + 8;
              iVar34 = iVar34 + 8;
            }
            auVar43 = vshufps_avx(auVar40,auVar40,0);
            while (iVar34 = iVar34 + 4, iVar34 <= iVar31) {
              auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar36 + lVar23),auVar43,auVar83);
              auVar84 = vfmadd213ps_fma(auVar84,*(undefined1 (*) [16])(*pauVar32 + lVar23),
                                        *(undefined1 (*) [16])(*pauVar37 + lVar23));
              *(undefined1 (*) [16])(*pauVar36 + lVar23) = auVar84;
              lVar23 = lVar23 + 0x10;
              lVar25 = lVar25 + 4;
            }
            for (; (int)lVar25 < iVar31; lVar25 = lVar25 + 1) {
              auVar83 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar36 + lVar25 * 4)),auVar40,auVar41);
              auVar83 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar32 + lVar25 * 4)),auVar83,
                                        ZEXT416(*(uint *)(*pauVar37 + lVar25 * 4)));
              *(int *)(*pauVar36 + lVar25 * 4) = auVar83._0_4_;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}